

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O1

void __thiscall NPC::Killed(NPC *this,Character *from,int amount,int spell_id)

{
  size_t *psVar1;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *this_00;
  pointer pcVar2;
  byte bVar3;
  ushort uVar4;
  undefined2 uVar5;
  World *pWVar6;
  pointer puVar7;
  NPC_Drop *pNVar8;
  EIF *pEVar9;
  Map *pMVar10;
  Party *this_01;
  long lVar11;
  NPC *this_02;
  NPC **__src;
  Quest_Context *this_03;
  _Base_ptr this_04;
  double dVar12;
  double dVar13;
  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
  *pmVar14;
  undefined8 uVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  mapped_type *pmVar23;
  NPC_Data *pNVar24;
  undefined4 extraout_var;
  _Node *p_Var25;
  ENF_Data *pEVar26;
  _Rb_tree_node_base *p_Var27;
  _List_iterator<NPC_*> __first;
  __normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_> __dest;
  Quest *this_05;
  _Base_ptr p_Var28;
  _List_node_base *p_Var29;
  ulong uVar30;
  size_t __n;
  uint uVar31;
  unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> *checkdrop;
  pointer puVar32;
  pointer ppNVar33;
  NPC *pNVar34;
  list<Character_*,_std::allocator<Character_*>_> *plVar35;
  short sVar36;
  Character *pCVar37;
  _List_node_base *p_Var38;
  _List_iterator<NPC_*> __last;
  NPC_Drop *pNVar39;
  pointer ppNVar40;
  pointer puVar41;
  _List_node_base *p_Var42;
  bool bVar43;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  shared_ptr<Map_Item> newitem;
  vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_> drops;
  set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_> parties;
  undefined1 local_120 [16];
  undefined1 local_110 [24];
  undefined1 local_f8 [16];
  undefined1 local_e8 [48];
  undefined1 local_b8 [32];
  _Rb_tree_node_base *local_98;
  Map *local_90;
  undefined8 local_88;
  undefined4 local_7c;
  double local_78;
  ulong local_70;
  _List_node_base *local_68;
  uint local_60;
  int local_5c;
  Character *local_58;
  Character *local_50;
  _List_node_base *local_48;
  ulong local_40;
  _List_node_base *local_38;
  
  pWVar6 = this->map->world;
  pcVar2 = local_b8 + 0x10;
  local_110._20_4_ = spell_id;
  local_e8._40_8_ = from;
  local_b8._0_8_ = pcVar2;
  local_5c = amount;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"DropRate","");
  pmVar23 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar6->config,(key_type *)local_b8);
  dVar12 = util::variant::GetFloat(pmVar23);
  if ((pointer)local_b8._0_8_ != pcVar2) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  pWVar6 = this->map->world;
  local_b8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"ExpRate","");
  pmVar23 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar6->config,(key_type *)local_b8);
  local_78 = util::variant::GetFloat(pmVar23);
  if ((pointer)local_b8._0_8_ != pcVar2) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  pWVar6 = this->map->world;
  local_b8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"ShareMode","");
  pmVar23 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar6->config,(key_type *)local_b8);
  local_110._16_4_ = util::variant::GetInt(pmVar23);
  if ((pointer)local_b8._0_8_ != pcVar2) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  pWVar6 = this->map->world;
  local_b8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PartyShareMode","");
  pmVar23 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar6->config,(key_type *)local_b8);
  iVar17 = util::variant::GetInt(pmVar23);
  if ((pointer)local_b8._0_8_ != pcVar2) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  pWVar6 = this->map->world;
  local_b8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"DropRateMode","");
  pmVar23 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar6->config,(key_type *)local_b8);
  iVar18 = util::variant::GetInt(pmVar23);
  if ((pointer)local_b8._0_8_ != pcVar2) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  local_b8._24_8_ = local_b8 + 8;
  local_b8._8_4_ = _S_red;
  local_b8._16_8_ = 0;
  local_90 = (Map *)0x0;
  this->alive = false;
  local_98 = (_Rb_tree_node_base *)local_b8._24_8_;
  dVar13 = Timer::GetTime();
  this->dead_since = (double)(int)dVar13;
  if (iVar18 == 3) {
    World::GetNpcData(this->map->world,(short)this->id);
    util::rand();
    pNVar24 = World::GetNpcData(this->map->world,(short)this->id);
    puVar32 = (pNVar24->drops).
              super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (pNVar24->drops).
             super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar32 == puVar7) goto LAB_0017c992;
    pNVar39 = (NPC_Drop *)0x0;
    do {
      puVar41 = puVar32 + 1;
      pNVar8 = (puVar32->_M_t).super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
               super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
               super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl;
      if (((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) < pNVar8->chance_offset) ||
         (pNVar8->chance_offset + pNVar8->chance <=
          (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01))) {
        bVar43 = false;
      }
      else {
        bVar43 = true;
        pNVar39 = pNVar8;
      }
    } while ((!bVar43) && (puVar32 = puVar41, puVar41 != puVar7));
  }
  else if (iVar18 == 2) {
    pNVar24 = World::GetNpcData(this->map->world,(short)this->id);
    puVar32 = (pNVar24->drops).
              super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (pNVar24->drops).
             super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar32 == puVar7) goto LAB_0017c992;
    do {
      puVar41 = puVar32 + 1;
      util::rand();
      pNVar39 = (puVar32->_M_t).super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t
                .super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl;
      if ((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) <= pNVar39->chance * dVar12)
      break;
      pNVar39 = (NPC_Drop *)0x0;
      puVar32 = puVar41;
    } while (puVar41 != puVar7);
  }
  else if (iVar18 == 1) {
    local_f8._0_8_ = (NPC *)0x0;
    local_f8._8_8_ = (NPC *)0x0;
    local_e8._0_8_ = (NPC **)0x0;
    pNVar24 = World::GetNpcData(this->map->world,(short)this->id);
    puVar32 = (pNVar24->drops).
              super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (pNVar24->drops).
             super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar32 != puVar7) {
      do {
        util::rand();
        if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) <=
            ((puVar32->_M_t).super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
             super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
             super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl)->chance * dVar12) {
          local_120._0_8_ =
               (puVar32->_M_t).super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
               super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
               super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl;
          std::vector<NPC_Drop*,std::allocator<NPC_Drop*>>::emplace_back<NPC_Drop*>
                    ((vector<NPC_Drop*,std::allocator<NPC_Drop*>> *)local_f8,(NPC_Drop **)local_120)
          ;
        }
        puVar32 = puVar32 + 1;
      } while (puVar32 != puVar7);
    }
    if (local_f8._8_8_ == local_f8._0_8_) {
      pNVar39 = (NPC_Drop *)0x0;
    }
    else {
      iVar18 = util::rand();
      pNVar39 = *(NPC_Drop **)(local_f8._0_8_ + (long)iVar18 * 8);
    }
    if ((NPC *)local_f8._0_8_ != (NPC *)0x0) {
      operator_delete((void *)local_f8._0_8_,local_e8._0_8_ - local_f8._0_8_);
    }
  }
  else {
LAB_0017c992:
    pNVar39 = (NPC_Drop *)0x0;
  }
  local_70 = 0;
  if (local_110._16_4_ == 1) {
    p_Var29 = (this->damagelist).
              super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    iVar18 = 0;
    if (p_Var29 == (_List_node_base *)&this->damagelist) goto LAB_0017c9f0;
    local_58 = (Character *)0x0;
    do {
      iVar21 = *(int *)&(p_Var29[1]._M_next)->_M_prev;
      if (iVar18 < iVar21) {
        local_58 = (Character *)(p_Var29[1]._M_next)->_M_next;
        iVar18 = iVar21;
      }
      p_Var29 = p_Var29->_M_next;
    } while (p_Var29 != (_List_node_base *)&this->damagelist);
  }
  else {
LAB_0017c9f0:
    local_58 = (Character *)0x0;
  }
  if (pNVar39 == (NPC_Drop *)0x0) {
    uVar19 = 0;
  }
  else {
    uVar4 = pNVar39->id;
    uVar31 = (uint)uVar4;
    uVar19 = util::rand();
    pWVar6 = this->map->world;
    local_f8._0_8_ = (NPC *)local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"MaxItem","");
    pmVar23 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar6->config,(key_type *)local_f8);
    uVar20 = util::variant::GetInt(pmVar23);
    if ((int)uVar20 < (int)uVar19) {
      uVar19 = uVar20;
    }
    local_70 = (ulong)uVar19;
    if ((NPC *)local_f8._0_8_ != (NPC *)local_e8) {
      operator_delete((void *)local_f8._0_8_,local_e8._0_8_ + 1);
    }
    uVar19 = (uint)uVar4;
    if (uVar4 != 0) {
      local_88._0_1_ = '\0';
      local_88._1_1_ = '\0';
      local_88._2_2_ = 0;
      local_88._4_1_ = '\0';
      local_88._5_1_ = '\0';
      local_88._6_2_ = 0;
      uVar19 = (uint)uVar4;
      if ((0 < (int)local_70) &&
         (pEVar9 = this->map->world->eif,
         uVar30 = ((long)(pEVar9->data).
                         super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pEVar9->data).
                         super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
         uVar4 <= uVar30 && uVar30 - uVar4 != 0)) {
        local_88._0_4_ = Map::GenerateItemID(this->map);
        local_88._4_4_ = extraout_var;
        iVar18 = Character::PlayerID((Character *)local_e8._40_8_);
        dVar12 = Timer::GetTime();
        pWVar6 = this->map->world;
        local_f8._0_8_ = (NPC *)local_e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"ProtectNPCDrop","");
        pmVar23 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&pWVar6->config,(key_type *)local_f8);
        iVar21 = util::variant::GetInt(pmVar23);
        local_120._0_8_ = (NPC_Drop *)0x0;
        local_120._8_8_ = operator_new(0x28);
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_)->_M_use_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_)->_M_weak_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_)->_vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_001d39a0;
        local_120._0_8_ = local_120._8_8_ + 0x10;
        uVar5 = *(undefined2 *)&this->x;
        *(short *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_120._8_8_ + 0x10))->
                   _vptr__Sp_counted_base = (short)local_88;
        *(ushort *)
         ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_120._8_8_ + 0x10))->
                 _vptr__Sp_counted_base + 2) = uVar4;
        *(int *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_120._8_8_ + 0x10))->
                        _vptr__Sp_counted_base + 4) = (int)local_70;
        *(undefined2 *)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_120._8_8_ + 0x10))->_M_use_count =
             uVar5;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_120._8_8_ + 0x10))->_M_weak_count =
             iVar18;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_120._8_8_ + 0x20))->
        _vptr__Sp_counted_base = (_func_int **)(dVar12 + (double)iVar21);
        if ((NPC *)local_f8._0_8_ != (NPC *)local_e8) {
          operator_delete((void *)local_f8._0_8_,local_e8._0_8_ + 1);
        }
        pMVar10 = this->map;
        p_Var25 = std::__cxx11::
                  list<std::shared_ptr<Map_Item>,std::allocator<std::shared_ptr<Map_Item>>>::
                  _M_create_node<std::shared_ptr<Map_Item>const&>
                            ((list<std::shared_ptr<Map_Item>,std::allocator<std::shared_ptr<Map_Item>>>
                              *)&pMVar10->items,(shared_ptr<Map_Item> *)local_120);
        std::__detail::_List_node_base::_M_hook(&p_Var25->super__List_node_base);
        psVar1 = &(pMVar10->items).
                  super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        switch(local_110._16_4_) {
        case 0:
          pCVar37 = (Character *)local_e8._40_8_;
          break;
        case 1:
          pCVar37 = local_58;
          break;
        case 2:
          iVar21 = 0;
          iVar18 = util::rand();
          pCVar37 = (Character *)0x0;
          p_Var29 = (_List_node_base *)&this->damagelist;
          do {
            p_Var29 = (((_List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                         *)&p_Var29->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            if (p_Var29 == (_List_node_base *)&this->damagelist) break;
            bVar16 = Character::InRange(*(Character **)p_Var29[1]._M_next,this);
            bVar43 = true;
            if (bVar16) {
              if ((iVar18 < iVar21) || (*(int *)((long)p_Var29[1]._M_next + 8) <= iVar18)) {
                iVar21 = iVar21 + *(int *)((long)p_Var29[1]._M_next + 8);
              }
              else {
                pCVar37 = *(Character **)p_Var29[1]._M_next;
                bVar43 = false;
              }
            }
          } while (bVar43);
          break;
        case 3:
          iVar18 = 0;
          iVar21 = util::rand();
          pCVar37 = (Character *)0x0;
          p_Var29 = (_List_node_base *)&this->damagelist;
          do {
            p_Var29 = (((_List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                         *)&p_Var29->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            if (p_Var29 == (_List_node_base *)&this->damagelist) break;
            bVar16 = Character::InRange(*(Character **)p_Var29[1]._M_next,this);
            bVar43 = true;
            if ((bVar16) &&
               (iVar22 = iVar18 + 1, bVar16 = iVar21 == iVar18, iVar18 = iVar22, bVar16)) {
              pCVar37 = *(Character **)p_Var29[1]._M_next;
              bVar43 = false;
            }
          } while (bVar43);
          break;
        default:
          pCVar37 = (Character *)0x0;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_);
        }
        goto LAB_0017cc2c;
      }
    }
  }
  uVar31 = uVar19;
  local_88._0_1_ = '\0';
  local_88._1_1_ = '\0';
  local_88._2_2_ = 0;
  local_88._4_1_ = '\0';
  local_88._5_1_ = '\0';
  local_88._6_2_ = 0;
  pCVar37 = (Character *)0x0;
LAB_0017cc2c:
  if (pCVar37 != (Character *)0x0) {
    iVar18 = Character::PlayerID(pCVar37);
    *(int *)((long)&((this->map->items).
                     super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                     ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next)->_M_prev + 4) =
         iVar18;
  }
  p_Var29 = (this->map->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  local_38 = (_List_node_base *)&this->map->characters;
  p_Var27 = (_Rb_tree_node_base *)local_b8._24_8_;
  if (p_Var29 != local_38) {
    p_Var42 = (_List_node_base *)&this->damagelist;
    local_7c = 0x2c;
    if (local_110._20_4_ == -1) {
      local_7c = 0x1a;
    }
    local_50 = pCVar37;
    if (pCVar37 == (Character *)0x0) {
      local_50 = (Character *)local_e8._40_8_;
    }
    bVar43 = local_110._16_4_ == 0;
    local_40 = (ulong)(uint)local_110._16_4_;
    local_68 = p_Var42;
    local_60 = uVar31;
    do {
      pCVar37 = (Character *)p_Var29[1]._M_next;
      p_Var38 = p_Var42;
      do {
        p_Var38 = (((_List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                     *)&p_Var38->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var38 == p_Var42) goto LAB_0017cce4;
      } while (*(Character **)p_Var38[1]._M_next != pCVar37);
      if (p_Var38 == p_Var42) {
LAB_0017cce4:
        bVar16 = Character::InRange(pCVar37,this);
        if (bVar16) goto LAB_0017ccf7;
      }
      else {
LAB_0017ccf7:
        PacketBuilder::PacketBuilder
                  ((PacketBuilder *)local_f8,(PacketFamily)local_7c,PACKET_SPEC,0x1a);
        pNVar24 = World::GetNpcData(this->map->world,(short)this->id);
        pEVar26 = NPC_Data::ENF(pNVar24);
        bVar16 = false;
        if ((p_Var38 != local_68) && (pEVar26->exp != 0)) {
          if ((uint)local_110._16_4_ < 4) {
            (*(code *)(&DAT_001a8b00 + *(int *)(&DAT_001a8b00 + local_40 * 4)))();
            return;
          }
          pWVar6 = this->map->world;
          local_120._0_8_ = local_110;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"MaxExp","");
          pmVar23 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar6->config,(key_type *)local_120);
          iVar21 = util::variant::GetInt(pmVar23);
          iVar18 = pCVar37->exp;
          if (iVar21 < pCVar37->exp) {
            iVar18 = iVar21;
          }
          pCVar37->exp = iVar18;
          if ((NPC_Drop *)local_120._0_8_ != (NPC_Drop *)local_110) {
            operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
          }
          bVar16 = false;
          local_48 = p_Var29;
          while( true ) {
            bVar3 = pCVar37->level;
            pWVar6 = this->map->world;
            local_120._0_8_ = local_110;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"MaxLevel","");
            pmVar23 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar6->config,(key_type *)local_120);
            iVar18 = util::variant::GetInt(pmVar23);
            if (iVar18 <= (int)(uint)bVar3) break;
            iVar18 = pCVar37->exp;
            iVar21 = (this->map->world->exp_table)._M_elems[(ulong)pCVar37->level + 1];
            if ((NPC *)local_120._0_8_ != (NPC *)local_110) {
              operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
            }
            if (iVar18 < iVar21) goto LAB_0017d154;
            pCVar37->level = pCVar37->level + '\x01';
            pWVar6 = this->map->world;
            local_120._0_8_ = local_110;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"StatPerLevel","");
            pmVar23 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar6->config,(key_type *)local_120);
            iVar18 = util::variant::GetInt(pmVar23);
            pCVar37->statpoints = pCVar37->statpoints + iVar18;
            if ((NPC_Drop *)local_120._0_8_ != (NPC_Drop *)local_110) {
              operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
            }
            pWVar6 = this->map->world;
            local_120._0_8_ = local_110;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"SkillPerLevel","");
            pmVar23 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar6->config,(key_type *)local_120);
            iVar18 = util::variant::GetInt(pmVar23);
            pCVar37->skillpoints = pCVar37->skillpoints + iVar18;
            if ((NPC_Drop *)local_120._0_8_ != (NPC_Drop *)local_110) {
              operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
            }
            bVar16 = true;
            Character::CalculateStats(pCVar37,true);
          }
          if ((NPC *)local_120._0_8_ != (NPC *)local_110) {
            operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
          }
LAB_0017d154:
          p_Var29 = local_48;
          if (bVar16) {
            PacketBuilder::SetID((PacketBuilder *)local_f8,(PacketFamily)local_7c,PACKET_ACCEPT);
            PacketBuilder::ReserveMore((PacketBuilder *)local_f8,0x21);
          }
        }
        if (local_110._20_4_ != -1) {
          PacketBuilder::AddShort((PacketBuilder *)local_f8,local_110._20_4_);
        }
        iVar18 = Character::PlayerID(local_50);
        PacketBuilder::AddShort((PacketBuilder *)local_f8,iVar18);
        PacketBuilder::AddChar((PacketBuilder *)local_f8,(uint)local_50->direction);
        PacketBuilder::AddShort((PacketBuilder *)local_f8,(uint)this->index);
        PacketBuilder::AddShort((PacketBuilder *)local_f8,(int)local_88);
        PacketBuilder::AddShort((PacketBuilder *)local_f8,local_60);
        PacketBuilder::AddChar((PacketBuilder *)local_f8,(uint)this->x);
        PacketBuilder::AddChar((PacketBuilder *)local_f8,(uint)this->y);
        PacketBuilder::AddInt((PacketBuilder *)local_f8,(int)local_70);
        PacketBuilder::AddThree((PacketBuilder *)local_f8,local_5c);
        if (local_110._20_4_ != -1) {
          PacketBuilder::AddShort((PacketBuilder *)local_f8,*(int *)(local_e8._40_8_ + 0xcc));
        }
        if ((pCVar37 == (Character *)local_e8._40_8_ && bVar43) ||
           (local_110._16_4_ != 0 && p_Var38 != local_68)) {
          PacketBuilder::AddInt((PacketBuilder *)local_f8,pCVar37->exp);
        }
        if (bVar16) {
          PacketBuilder::AddChar((PacketBuilder *)local_f8,(uint)pCVar37->level);
          PacketBuilder::AddShort((PacketBuilder *)local_f8,pCVar37->statpoints);
          PacketBuilder::AddShort((PacketBuilder *)local_f8,pCVar37->skillpoints);
          PacketBuilder::AddShort((PacketBuilder *)local_f8,pCVar37->maxhp);
          PacketBuilder::AddShort((PacketBuilder *)local_f8,pCVar37->maxtp);
          PacketBuilder::AddShort((PacketBuilder *)local_f8,pCVar37->maxsp);
        }
        Character::Send(pCVar37,(PacketBuilder *)local_f8);
        PacketBuilder::~PacketBuilder((PacketBuilder *)local_f8);
        p_Var42 = local_68;
      }
      p_Var29 = p_Var29->_M_next;
      p_Var27 = (_Rb_tree_node_base *)local_b8._24_8_;
    } while (p_Var29 != local_38);
  }
  for (; p_Var27 != (_Rb_tree_node_base *)(local_b8 + 8);
      p_Var27 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var27)) {
    this_01 = *(Party **)(p_Var27 + 1);
    Party::ShareEXP(this_01,this_01->temp_expsum,iVar17,this->map);
    this_01->temp_expsum = 0;
  }
  this_00 = &this->damagelist;
  p_Var29 = (this->damagelist).
            super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var29 != (_List_node_base *)this_00) {
    do {
      lVar11 = (long)(p_Var29[1]._M_next)->_M_next;
      __last._M_node = (_List_node_base *)(lVar11 + 0x378);
      local_f8._0_8_ = this;
      __first = std::
                __remove_if<std::_List_iterator<NPC*>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                          (*(_List_node_base **)(lVar11 + 0x378),__last,
                           (_Iter_equals_val<NPC_*const>)local_f8);
      std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::erase
                ((list<NPC_*,_std::allocator<NPC_*>_> *)__last._M_node,
                 (const_iterator)__first._M_node,(p_Var29[1]._M_next)->_M_next + 0x378);
      p_Var29 = p_Var29->_M_next;
    } while (p_Var29 != (_List_node_base *)this_00);
  }
  std::__cxx11::
  _List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ::_M_clear(&this_00->
              super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
            );
  (this->damagelist).
  super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->damagelist).
  super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->damagelist).
  super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->totaldamage = 0;
  pNVar24 = World::GetNpcData(this->map->world,(short)this->id);
  pEVar26 = NPC_Data::ENF(pNVar24);
  if (pEVar26->boss == 0) {
    iVar17 = -1;
  }
  else {
    local_f8._0_8_ = (NPC *)0x0;
    local_f8._8_8_ = (NPC *)0x0;
    local_e8._0_8_ = (NPC **)0x0;
    ppNVar33 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppNVar40 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppNVar33 != ppNVar40) {
      do {
        local_120._0_8_ = *ppNVar33;
        pNVar24 = World::GetNpcData(((NPC *)local_120._0_8_)->map->world,
                                    (short)((NPC *)local_120._0_8_)->id);
        pEVar26 = NPC_Data::ENF(pNVar24);
        if (pEVar26->child != 0) {
          pNVar24 = World::GetNpcData((*(Map **)(local_120._0_8_ + 0x58))->world,
                                      (short)*(int *)(local_120._0_8_ + 0x68));
          pEVar26 = NPC_Data::ENF(pNVar24);
          if ((pEVar26->boss == 0) && (*(char *)(local_120._0_8_ + 0x10) == '\x01')) {
            if (local_f8._8_8_ == local_e8._0_8_) {
              std::vector<NPC*,std::allocator<NPC*>>::_M_realloc_insert<NPC*const&>
                        ((vector<NPC*,std::allocator<NPC*>> *)local_f8,(iterator)local_f8._8_8_,
                         (NPC **)local_120);
            }
            else {
              *(undefined8 *)local_f8._8_8_ = local_120._0_8_;
              local_f8._8_8_ = local_f8._8_8_ + 8;
            }
          }
        }
        ppNVar33 = ppNVar33 + 1;
      } while (ppNVar33 != ppNVar40);
    }
    uVar15 = local_f8._8_8_;
    if (local_f8._0_8_ == local_f8._8_8_) {
      iVar17 = -1;
    }
    else {
      sVar36 = -1;
      pNVar34 = (NPC *)local_f8._0_8_;
      do {
        this_02 = *(NPC **)pNVar34;
        if ((this_02->temporary == false) && ((sVar36 == -1 || (this_02->id == (int)sVar36)))) {
          Die(this_02,false);
          sVar36 = (short)this_02->id;
        }
        else {
          Die(this_02,true);
        }
        pNVar34 = (NPC *)&pNVar34->parent;
      } while (pNVar34 != (NPC *)uVar15);
      iVar17 = (int)sVar36;
    }
    if ((NPC *)local_f8._0_8_ != (NPC *)0x0) {
      operator_delete((void *)local_f8._0_8_,local_e8._0_8_ - local_f8._0_8_);
    }
  }
  if (iVar17 != -1) {
    PacketBuilder::PacketBuilder((PacketBuilder *)local_f8,PACKET_NPC,PACKET_JUNK,2);
    PacketBuilder::AddShort((PacketBuilder *)local_f8,iVar17);
    plVar35 = &this->map->characters;
    p_Var29 = (_List_node_base *)plVar35;
    while (p_Var29 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var29->_M_next)->
                     _M_impl)._M_node.super__List_node_base._M_next,
          p_Var29 != (_List_node_base *)plVar35) {
      Character::Send((Character *)p_Var29[1]._M_next,(PacketBuilder *)local_f8);
    }
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_f8);
  }
  if (this->temporary == true) {
    pMVar10 = this->map;
    local_f8._0_8_ = this;
    __dest = std::
             __remove_if<__gnu_cxx::__normal_iterator<NPC**,std::vector<NPC*,std::allocator<NPC*>>>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                       ((__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>)
                        (pMVar10->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>)
                        (pMVar10->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                        super__Vector_impl_data._M_finish,(_Iter_equals_val<NPC_*const>)local_f8);
    __src = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (__dest._M_current != __src) {
      __n = (long)(pMVar10->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(__dest._M_current,__src,__n);
      }
      ppNVar33 = (pMVar10->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppNVar40 = (pointer)((long)__dest._M_current + ((long)ppNVar33 - (long)__src));
      if (ppNVar33 != ppNVar40) {
        (pMVar10->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppNVar40;
      }
    }
  }
  pmVar14 = (map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
             *)(local_e8._40_8_ + 0x390);
  for (p_Var28 = (((map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                    *)(local_e8._40_8_ + 0x390))->_M_t)._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
      (_Rb_tree_header *)p_Var28 != &(pmVar14->_M_t)._M_impl.super__Rb_tree_header;
      p_Var28 = (_Base_ptr)std::_Rb_tree_increment(p_Var28)) {
    this_03 = (Quest_Context *)p_Var28[1]._M_parent;
    this_04 = p_Var28[1]._M_left;
    if (this_04 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_04->_M_parent = *(int *)&this_04->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&this_04->_M_parent = *(int *)&this_04->_M_parent + 1;
      }
    }
    if (this_03 != (Quest_Context *)0x0) {
      this_05 = Quest_Context::GetQuest(this_03);
      bVar43 = Quest::Disabled(this_05);
      if (!bVar43) {
        pNVar24 = World::GetNpcData(this->map->world,(short)this->id);
        pEVar26 = NPC_Data::ENF(pNVar24);
        Quest_Context::KilledNPC(this_03,(short)pEVar26->id);
      }
    }
    if (this_04 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_04);
    }
  }
  if (this->temporary != false) {
    ~NPC(this);
    operator_delete(this,0x70);
  }
  std::
  _Rb_tree<Party_*,_Party_*,_std::_Identity<Party_*>,_std::less<Party_*>,_std::allocator<Party_*>_>
  ::~_Rb_tree((_Rb_tree<Party_*,_Party_*,_std::_Identity<Party_*>,_std::less<Party_*>,_std::allocator<Party_*>_>
               *)local_b8);
  return;
}

Assistant:

void NPC::Killed(Character *from, int amount, int spell_id)
{
	double droprate = this->map->world->config["DropRate"];
	double exprate = this->map->world->config["ExpRate"];
	int sharemode = this->map->world->config["ShareMode"];
	int partysharemode = this->map->world->config["PartyShareMode"];
	int dropratemode = this->map->world->config["DropRateMode"];
	std::set<Party *> parties;

	int most_damage_counter = 0;
	Character *most_damage = nullptr;
	NPC_Drop *drop = nullptr;

	this->alive = false;

	this->dead_since = int(Timer::GetTime());

	if (dropratemode == 1)
	{
		std::vector<NPC_Drop *> drops;

		UTIL_FOREACH_CREF(this->Data().drops, checkdrop)
		{
			if (util::rand(0.0, 100.0) <= checkdrop->chance * droprate)
			{
				drops.push_back(checkdrop.get());
			}
		}

		if (drops.size() > 0)
		{
			drop = drops[util::rand(0, drops.size()-1)];
		}
	}
	else if (dropratemode == 2)
	{
		UTIL_FOREACH_CREF(this->Data().drops, checkdrop)
		{
			if (util::rand(0.0, 100.0) <= checkdrop->chance * droprate)
			{
				drop = checkdrop.get();
				break;
			}
		}
	}
	else if (dropratemode == 3)
	{
		double roll = util::rand(0.0, this->Data().drops_chance_total);

		UTIL_FOREACH_CREF(this->Data().drops, checkdrop)
		{
			if (roll >= checkdrop->chance_offset && roll < checkdrop->chance_offset+checkdrop->chance)
			{
				drop = checkdrop.get();
				break;
			}
		}
	}

	if (sharemode == 1)
	{
		UTIL_FOREACH_CREF(this->damagelist, opponent)
		{
			if (opponent->damage > most_damage_counter)
			{
				most_damage_counter = opponent->damage;
				most_damage = opponent->attacker;
			}
		}
	}

	int dropuid = 0;
	int dropid = 0;
	int dropamount = 0;
	Character* drop_winner = nullptr;

	if (drop)
	{
		dropid = drop->id;
		dropamount = std::min<int>(util::rand(drop->min, drop->max), this->map->world->config["MaxItem"]);

		if (dropid <= 0 || static_cast<std::size_t>(dropid) >= this->map->world->eif->data.size() || dropamount <= 0)
			goto abort_drop;

		dropuid = this->map->GenerateItemID();

		std::shared_ptr<Map_Item> newitem(std::make_shared<Map_Item>(dropuid, dropid, dropamount, this->x, this->y, from->PlayerID(), Timer::GetTime() + static_cast<int>(this->map->world->config["ProtectNPCDrop"])));
		this->map->items.push_back(newitem);

		// Selects a random number between 0 and maxhp, and decides the winner based on that
		switch (sharemode)
		{
			case 0:
				drop_winner = from;
				break;

			case 1:
				drop_winner = most_damage;
				break;

			case 2:
			{
				int rewarded_hp = util::rand(0, this->totaldamage - 1);
				int count_hp = 0;
				UTIL_FOREACH_CREF(this->damagelist, opponent)
				{
					if (opponent->attacker->InRange(this))
					{
						if (rewarded_hp >= count_hp && rewarded_hp < opponent->damage)
						{
							drop_winner = opponent->attacker;
							break;
						}

						count_hp += opponent->damage;
					}
				}
			}
				break;

			case 3:
			{
				int rand = util::rand(0, this->damagelist.size() - 1);
				int i = 0;
				UTIL_FOREACH_CREF(this->damagelist, opponent)
				{
					if (opponent->attacker->InRange(this))
					{
						if (rand == i++)
						{
							drop_winner = opponent->attacker;
							break;
						}
					}
				}
			}
				break;
		}
	}
	abort_drop:

	if (drop_winner)
		this->map->items.back()->owner = drop_winner->PlayerID();

	UTIL_FOREACH(this->map->characters, character)
	{
		std::list<std::unique_ptr<NPC_Opponent>>::iterator findopp = this->damagelist.begin();
		for (; findopp != this->damagelist.end() && (*findopp)->attacker != character; ++findopp); // no loop body

		if (findopp != this->damagelist.end() || character->InRange(this))
		{
			bool level_up = false;

			PacketBuilder builder(spell_id == -1 ? PACKET_NPC : PACKET_CAST, PACKET_SPEC, 26);

			if (this->ENF().exp != 0)
			{
				if (findopp != this->damagelist.end())
				{
					int reward;
					switch (sharemode)
					{
						case 0:
							if (character == from)
							{
								reward = int(std::ceil(double(this->ENF().exp) * exprate));

								if (reward > 0)
								{
									if (partysharemode)
									{
										if (character->party)
										{
											character->party->ShareEXP(reward, partysharemode, this->map);
										}
										else
										{
											character->exp += reward;
										}
									}
									else
									{
										character->exp += reward;
									}
								}
							}
							break;

						case 1:
							if (character == most_damage)
							{
								reward = int(std::ceil(double(this->ENF().exp) * exprate));

								if (reward > 0)
								{
									if (partysharemode)
									{
										if (character->party)
										{
											character->party->ShareEXP(reward, partysharemode, this->map);
										}
										else
										{
											character->exp += reward;
										}
									}
									else
									{
										character->exp += reward;
									}
								}
							}
							break;

						case 2:
							reward = int(std::ceil(double(this->ENF().exp) * exprate * (double((*findopp)->damage) / double(this->totaldamage))));

							if (reward > 0)
							{
								if (partysharemode)
								{
									if (character->party)
									{
										character->party->temp_expsum += reward;
										parties.insert(character->party);
									}
									else
									{
										character->exp += reward;
									}
								}
								else
								{
									character->exp += reward;
								}
							}
							break;

						case 3:
							reward = int(std::ceil(double(this->ENF().exp) * exprate * (double(this->damagelist.size()) / 1.0)));

							if (reward > 0)
							{
								if (partysharemode)
								{
									if (character->party)
									{
										character->party->temp_expsum += reward;
									}
									else
									{
										character->exp += reward;
									}
								}
								else
								{
									character->exp += reward;
								}
							}
							break;
					}

					character->exp = std::min(character->exp, static_cast<int>(this->map->world->config["MaxExp"]));

					while (character->level < static_cast<int>(this->map->world->config["MaxLevel"]) && character->exp >= this->map->world->exp_table[character->level+1])
					{
						level_up = true;
						++character->level;
						character->statpoints += static_cast<int>(this->map->world->config["StatPerLevel"]);
						character->skillpoints += static_cast<int>(this->map->world->config["SkillPerLevel"]);
						character->CalculateStats();
					}

					if (level_up)
					{
						builder.SetID(spell_id == -1 ? PACKET_NPC : PACKET_CAST, PACKET_ACCEPT);
						builder.ReserveMore(33);
					}
				}
			}

			if (spell_id != -1)
				builder.AddShort(spell_id);

			builder.AddShort(drop_winner ? drop_winner->PlayerID() : from->PlayerID());
			builder.AddChar(drop_winner ? drop_winner->direction : from->direction);
			builder.AddShort(this->index);
			builder.AddShort(dropuid);
			builder.AddShort(dropid);
			builder.AddChar(this->x);
			builder.AddChar(this->y);
			builder.AddInt(dropamount);
			builder.AddThree(amount);

			if (spell_id != -1)
				builder.AddShort(from->tp);

			if ((sharemode == 0 && character == from) || (sharemode != 0 && findopp != this->damagelist.end()))
			{
				builder.AddInt(character->exp);
			}

			if (level_up)
			{
				builder.AddChar(character->level);
				builder.AddShort(character->statpoints);
				builder.AddShort(character->skillpoints);
				builder.AddShort(character->maxhp);
				builder.AddShort(character->maxtp);
				builder.AddShort(character->maxsp);
			}

			character->Send(builder);
		}
	}

	UTIL_FOREACH(parties, party)
	{
		party->ShareEXP(party->temp_expsum, partysharemode, this->map);
		party->temp_expsum = 0;
	}

	UTIL_FOREACH_CREF(this->damagelist, opponent)
	{
		opponent->attacker->unregister_npc.erase(
			std::remove(UTIL_RANGE(opponent->attacker->unregister_npc), this),
			opponent->attacker->unregister_npc.end()
		);
	}

	this->damagelist.clear();
	this->totaldamage = 0;

	short childid = -1;

	if (this->ENF().boss)
	{
		std::vector<NPC*> child_npcs;

		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().child && !npc->ENF().boss && npc->alive)
			{
				child_npcs.push_back(npc);
			}
		}

		UTIL_FOREACH(child_npcs, npc)
		{
			if (!npc->temporary && (childid == -1 || childid == npc->id))
			{
				npc->Die(false);
				childid = npc->id;
			}
			else
			{
				npc->Die(true);
			}
		}
	}

	if (childid != -1)
	{
		PacketBuilder builder(PACKET_NPC, PACKET_JUNK, 2);
		builder.AddShort(childid);

		UTIL_FOREACH(this->map->characters, character)
		{
			character->Send(builder);
		}
	}

	if (this->temporary)
	{
		this->map->npcs.erase(
			std::remove(this->map->npcs.begin(), this->map->npcs.end(), this),
			this->map->npcs.end()
		);
	}

	UTIL_FOREACH(from->quests, q)
	{
		if (!q.second || q.second->GetQuest()->Disabled())
			continue;

		q.second->KilledNPC(this->ENF().id);
	}

	if (this->temporary)
	{
		delete this;
		return;
	}
}